

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O3

void __thiscall
SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U>::insert
          (SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U> *this,uint *key,
          bool *value)

{
  uint uVar1;
  uint uVar2;
  Node *pNVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  
  if (*key == 0) {
    __assert_fail("key != Key()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                  ,0x3b,
                  "void SmallDenseMap<unsigned int, bool, SmallDenseMapUnsignedHasher, 128>::insert(const Key &, const Value &) [Key = unsigned int, Value = bool, Hasher = SmallDenseMapUnsignedHasher, N = 128]"
                 );
  }
  uVar4 = this->bucketCount;
  if (uVar4 <= (this->count >> 2) + this->count) {
    rehash(this);
    uVar4 = this->bucketCount;
    if (uVar4 == 0) goto LAB_0011a31b;
  }
  uVar1 = uVar4 - 1;
  uVar2 = *key;
  uVar5 = uVar2 * -0x61c88647;
  pNVar3 = this->data;
  iVar6 = 0;
  do {
    uVar5 = uVar5 & uVar1;
    if (pNVar3[uVar5].key == 0) {
      pNVar3[uVar5].key = uVar2;
      pNVar3[uVar5].value = *value;
      this->count = this->count + 1;
      return;
    }
    if (pNVar3[uVar5].key == uVar2) {
      pNVar3[uVar5].value = *value;
      return;
    }
    uVar5 = uVar5 + iVar6 + 1;
    iVar6 = iVar6 + 1;
    uVar4 = uVar4 - 1;
  } while (uVar4 != 0);
LAB_0011a31b:
  __assert_fail("!\"couldn\'t insert node\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                ,0x5b,
                "void SmallDenseMap<unsigned int, bool, SmallDenseMapUnsignedHasher, 128>::insert(const Key &, const Value &) [Key = unsigned int, Value = bool, Hasher = SmallDenseMapUnsignedHasher, N = 128]"
               );
}

Assistant:

void insert(const Key& key, const Value& value)
	{
		// Default value is used as an empty marker
		assert(key != Key());

		// Keep occupancy at <80%
		if(count + (count >> 2) >= bucketCount)
			rehash();

		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
			{
				item.key = key;
				item.value = value;

				count++;
				return;
			}

			if(item.key == key)
			{
				item.value = value;
				return;
			}

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		assert(!"couldn't insert node");
	}